

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O2

void normalize_suite::normalize_decreasing(void)

{
  array<int,_4UL> *paVar1;
  initializer_list<int> input;
  initializer_list<int> __l;
  initializer_list<int> input_00;
  initializer_list<int> __l_00;
  initializer_list<int> input_01;
  initializer_list<int> __l_01;
  iterator iVar2;
  allocator_type local_f9;
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,_18446744073709551615UL> span;
  array<int,_4UL> array;
  int local_9c [3];
  iterator local_90;
  iterator local_80;
  iterator local_70;
  iterator local_60;
  iterator local_50;
  iterator local_40;
  
  array._M_elems[0] = 0;
  array._M_elems[1] = 0;
  array._M_elems[2] = 0;
  array._M_elems[3] = 0;
  span.member.cap = 4;
  span.member.size = 0;
  span.member.next = 4;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x2c00000021;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x160000000b;
  input._M_len = 4;
  input._M_array = (iterator)&expect;
  span.member.data = array._M_elems;
  vista::circular_view<int,_18446744073709551615UL>::assign(&span,input);
  vista::circular_view<int,_18446744073709551615UL>::remove_front(&span,1);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._0_16_ =
       vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  paVar1 = (array<int,_4UL> *)
           vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&expect);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) != std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe04,"void normalize_suite::normalize_decreasing()",paVar1 != &array);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front(&span);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._0_16_ =
       vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  paVar1 = (array<int,_4UL> *)
           vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&expect);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe06,"void normalize_suite::normalize_decreasing()",paVar1 == &array);
  local_9c[0] = 0x16;
  local_9c[1] = 0x21;
  local_9c[2] = 0x2c;
  __l._M_len = 3;
  __l._M_array = local_9c;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l,&local_f9);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_40 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe0a,"void normalize_suite::normalize_decreasing()",iVar2,local_40,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_50 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe0c,"void normalize_suite::normalize_decreasing()",iVar2,local_50,array._M_elems,
             array._M_elems + span.member.size);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x2c00000021;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x160000000b;
  input_00._M_len = 4;
  input_00._M_array = (iterator)&expect;
  vista::circular_view<int,_18446744073709551615UL>::assign(&span,input_00);
  vista::circular_view<int,_18446744073709551615UL>::remove_front(&span,2);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._0_16_ =
       vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  paVar1 = (array<int,_4UL> *)
           vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&expect);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) != std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe12,"void normalize_suite::normalize_decreasing()",paVar1 != &array);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front(&span);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._0_16_ =
       vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  paVar1 = (array<int,_4UL> *)
           vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&expect);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe14,"void normalize_suite::normalize_decreasing()",paVar1 == &array);
  local_9c[0] = 0x21;
  local_9c[1] = 0x2c;
  __l_00._M_len = 2;
  __l_00._M_array = local_9c;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l_00,&local_f9);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_60 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe18,"void normalize_suite::normalize_decreasing()",iVar2,local_60,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_70 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe1a,"void normalize_suite::normalize_decreasing()",iVar2,local_70,array._M_elems,
             array._M_elems + span.member.size);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x2c00000021;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x160000000b;
  input_01._M_len = 4;
  input_01._M_array = (iterator)&expect;
  vista::circular_view<int,_18446744073709551615UL>::assign(&span,input_01);
  vista::circular_view<int,_18446744073709551615UL>::remove_front(&span,3);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._0_16_ =
       vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  paVar1 = (array<int,_4UL> *)
           vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&expect);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) != std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe20,"void normalize_suite::normalize_decreasing()",paVar1 != &array);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front(&span);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._0_16_ =
       vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  paVar1 = (array<int,_4UL> *)
           vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&expect);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe22,"void normalize_suite::normalize_decreasing()",paVar1 == &array);
  local_9c[0] = 0x2c;
  __l_01._M_len = 1;
  __l_01._M_array = local_9c;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l_01,&local_f9);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_80 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe26,"void normalize_suite::normalize_decreasing()",iVar2,local_80,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_90 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe28,"void normalize_suite::normalize_decreasing()",iVar2,local_90,array._M_elems,
             array._M_elems + span.member.size);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void normalize_decreasing()
{
    std::array<int, 4> array = {};
    circular_view<int> span(array.begin(), array.end());
    {
        // X 22 33 44 => 22 33 44 X
        span = { 11, 22, 33, 44 };
        span.remove_front();
        BOOST_TEST(std::addressof(*span.begin()) != std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 22, 33, 44 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.begin() + span.size());
    }
    {
        // X X 33 44 => 33 44 X X
        span = { 11, 22, 33, 44 };
        span.remove_front(2);
        BOOST_TEST(std::addressof(*span.begin()) != std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 33, 44 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.begin() + span.size());
    }
    {
        // X X X 44 => 44 X X X
        span = { 11, 22, 33, 44 };
        span.remove_front(3);
        BOOST_TEST(std::addressof(*span.begin()) != std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 44 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.begin() + span.size());
    }
}